

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

void __thiscall
chrono::ChFrameMoving<double>::ChFrameMoving
          (ChFrameMoving<double> *this,ChVector<double> *mv,ChQuaternion<double> *mq)

{
  (this->super_ChFrame<double>)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->super_ChFrame<double>).coord.pos.m_data[0] = mv->m_data[0];
  (this->super_ChFrame<double>).coord.pos.m_data[1] = mv->m_data[1];
  (this->super_ChFrame<double>).coord.pos.m_data[2] = mv->m_data[2];
  (this->super_ChFrame<double>).coord.rot.m_data[0] = mq->m_data[0];
  (this->super_ChFrame<double>).coord.rot.m_data[1] = mq->m_data[1];
  (this->super_ChFrame<double>).coord.rot.m_data[2] = mq->m_data[2];
  (this->super_ChFrame<double>).coord.rot.m_data[3] = mq->m_data[3];
  ChMatrix33<double>::ChMatrix33(&(this->super_ChFrame<double>).Amatrix,mq);
  (this->super_ChFrame<double>)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  (this->coord_dt).pos.m_data[0] = 0.0;
  (this->coord_dt).pos.m_data[1] = 0.0;
  (this->coord_dt).pos.m_data[2] = 0.0;
  (this->coord_dtdt).pos.m_data[0] = 0.0;
  (this->coord_dtdt).pos.m_data[1] = 0.0;
  (this->coord_dtdt).pos.m_data[2] = 0.0;
  *(undefined1 (*) [32])(this->coord_dt).rot.m_data = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])(this->coord_dtdt).rot.m_data = ZEXT432(0) << 0x40;
  return;
}

Assistant:

explicit ChFrameMoving(const ChVector<Real>& mv = ChVector<Real>(0, 0, 0),
                           const ChQuaternion<Real>& mq = ChQuaternion<Real>(1, 0, 0, 0))
        : ChFrame<Real>(mv, mq) {
        coord_dt.rot = coord_dtdt.rot = ChQuaternion<Real>(0, 0, 0, 0);
    }